

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

void __thiscall cfd::core::HashUtil::HashUtil(HashUtil *this,uint8_t hash_type)

{
  long lVar1;
  long lVar2;
  CfdException *this_00;
  allocator local_41;
  string local_40;
  
  this->_vptr_HashUtil = (_func_int **)&PTR__HashUtil_006f4c28;
  this->hash_type_ = hash_type;
  ByteData::ByteData(&this->buffer_);
  lVar2 = 0;
  while ((lVar2 != 0xf0 && (lVar1 = lVar2 + 0x20, kFormatList[lVar1] != '\0'))) {
    lVar2 = lVar2 + 0x28;
    if (kFormatList[lVar1] == hash_type) {
      return;
    }
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_40,"unknown hash type.",&local_41);
  CfdException::CfdException(this_00,kCfdInternalError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

HashUtil::HashUtil(uint8_t hash_type) : hash_type_(hash_type) {
  for (const auto &item : kFormatList) {
    if (item.type == 0) break;
    if (hash_type == item.type) return;
  }
  throw CfdException(kCfdInternalError, "unknown hash type.");
}